

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall cmListFileParser::ParseFile(cmListFileParser *this)

{
  bool bVar1;
  int iVar2;
  cmListFileLexer_Token *pcVar3;
  char *pcVar4;
  size_t sVar5;
  cmListFileLexer_BOM bom;
  ostringstream error;
  undefined1 auStack_1c8 [4];
  cmListFileLexer_BOM local_1c4;
  string local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  iVar2 = cmListFileLexer_SetFileName(this->Lexer,this->FileName,&local_1c4);
  if (iVar2 == 0) {
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"cmListFileCache: error can not open file.","");
    cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,(string *)local_1a0,&this->Backtrace);
  }
  else if (local_1c4 == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"Error while reading Byte-Order-Mark. File not seekable?","");
    cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,(string *)local_1a0,&this->Backtrace);
  }
  else {
    if ((local_1c4 & ~cmListFileLexer_BOM_UTF8) == cmListFileLexer_BOM_None) {
      pcVar3 = cmListFileLexer_Scan(this->Lexer);
      if (pcVar3 != (cmListFileLexer_Token *)0x0) {
        bVar1 = true;
        do {
          switch(pcVar3->type) {
          case cmListFileLexer_Token_Space:
            break;
          case cmListFileLexer_Token_Newline:
            bVar1 = true;
            break;
          case cmListFileLexer_Token_Identifier:
            if (!bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,"Parse error.  Expected a newline, got ",0x26);
              pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
              if (pcVar4 == (char *)0x0) {
                std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) +
                                0x28);
              }
              else {
                sVar5 = strlen(pcVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,pcVar4,sVar5);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0," with text \"",0xc);
              pcVar4 = pcVar3->text;
              if (pcVar4 == (char *)0x0) {
                std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) +
                                0x28);
              }
              else {
                sVar5 = strlen(pcVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,pcVar4,sVar5);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\".",2);
              std::__cxx11::stringbuf::str();
              IssueError(this,&local_1c0);
              goto LAB_00176753;
            }
            bVar1 = ParseFunction(this,pcVar3->text,(long)pcVar3->line,(long)pcVar3->column);
            if (!bVar1) {
              return false;
            }
            std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
                      (&this->ListFile->Functions,&this->Function);
          case cmListFileLexer_Token_CommentBracket:
            bVar1 = false;
            break;
          default:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a0,"Parse error.  Expected a command name, got ",0x2b);
            pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
            if (pcVar4 == (char *)0x0) {
              std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) +
                              0x28);
            }
            else {
              sVar5 = strlen(pcVar4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a0," with text \"",0xc);
            pcVar4 = pcVar3->text;
            if (pcVar4 == (char *)0x0) {
              std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) +
                              0x28);
            }
            else {
              sVar5 = strlen(pcVar4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\".",2);
            std::__cxx11::stringbuf::str();
            IssueError(this,&local_1c0);
LAB_00176753:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
            std::ios_base::~ios_base(local_130);
            return false;
          }
          pcVar3 = cmListFileLexer_Scan(this->Lexer);
        } while (pcVar3 != (cmListFileLexer_Token *)0x0);
      }
      return true;
    }
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"File starts with a Byte-Order-Mark that is not UTF-8.","");
    cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,(string *)local_1a0,&this->Backtrace);
  }
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  return false;
}

Assistant:

bool cmListFileParser::ParseFile()
{
  // Open the file.
  cmListFileLexer_BOM bom;
  if (!cmListFileLexer_SetFileName(this->Lexer, this->FileName, &bom)) {
    this->IssueFileOpenError("cmListFileCache: error can not open file.");
    return false;
  }

  if (bom == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer, nullptr, nullptr);
    this->IssueFileOpenError("Error while reading Byte-Order-Mark. "
                             "File not seekable?");
    return false;
  }

  // Verify the Byte-Order-Mark, if any.
  if (bom != cmListFileLexer_BOM_None && bom != cmListFileLexer_BOM_UTF8) {
    cmListFileLexer_SetFileName(this->Lexer, nullptr, nullptr);
    this->IssueFileOpenError(
      "File starts with a Byte-Order-Mark that is not UTF-8.");
    return false;
  }

  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while (cmListFileLexer_Token* token = cmListFileLexer_Scan(this->Lexer)) {
    if (token->type == cmListFileLexer_Token_Space) {
    } else if (token->type == cmListFileLexer_Token_Newline) {
      haveNewline = true;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      haveNewline = false;
    } else if (token->type == cmListFileLexer_Token_Identifier) {
      if (haveNewline) {
        haveNewline = false;
        if (this->ParseFunction(token->text, token->line, token->column)) {
          this->ListFile->Functions.push_back(this->Function);
        } else {
          return false;
        }
      } else {
        std::ostringstream error;
        error << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        this->IssueError(error.str());
        return false;
      }
    } else {
      std::ostringstream error;
      error << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }
  return true;
}